

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevII.cpp
# Opt level: O3

void __thiscall
Iir::ChebyshevII::BandStopBase::setup
          (BandStopBase *this,int order,double centerFrequency,double widthFrequency,
          double stopBandDb)

{
  AnalogLowPass *this_00;
  LayoutBase *digital;
  BandStopTransform local_48;
  
  this_00 = &(this->super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>).m_analogProto;
  AnalogLowPass::design(this_00,order,stopBandDb);
  digital = &(this->super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>).super_PoleFilterBase2.
             m_digitalProto;
  BandStopTransform::BandStopTransform
            (&local_48,centerFrequency,widthFrequency,digital,&this_00->super_LayoutBase);
  Cascade::setLayout((Cascade *)this,digital);
  return;
}

Assistant:

void BandStopBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency,
                          double stopBandDb)
{
  m_analogProto.design (order, stopBandDb);

  BandStopTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}